

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracerTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::Tracer_testPropagation_Test::TestBody(Tracer_testPropagation_Test *this)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  bool bVar1;
  byte bVar2;
  uchar flags;
  element_type *peVar3;
  pointer pSVar4;
  undefined8 uVar5;
  char *pcVar6;
  value_type *pvVar7;
  pointer pSVar8;
  SpanContext *pSVar9;
  type pSVar10;
  mapped_type *pmVar11;
  TraceID *pTVar12;
  uint64_t uVar13;
  uint64_t uVar14;
  StrMap *pSVar15;
  pointer ppVar16;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_16a0;
  AssertHelper local_1340 [8];
  Message local_1338 [8];
  undefined1 local_1330 [8];
  AssertionResult gtest_ar_14;
  Message local_1318 [8];
  size_type local_1310;
  int local_1304;
  undefined1 local_1300 [8];
  AssertionResult gtest_ar_13;
  AssertHelper local_12d0 [8];
  Message local_12c8 [15];
  bool local_12b9;
  undefined1 local_12b8 [8];
  AssertionResult gtest_ar__15;
  AssertHelper local_1288 [8];
  Message local_1280 [15];
  bool local_1271;
  undefined1 local_1270 [8];
  AssertionResult gtest_ar__14;
  allocator local_1241;
  key_type local_1240;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_1220;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_1218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1210;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_11f0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_11e8;
  iterator itr;
  allocator local_11c1;
  string local_11c0;
  allocator local_1199;
  string local_1198;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1173;
  key_equal local_1172;
  hasher local_1171;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1170;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1168;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1128;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10e8;
  iterator local_10a8;
  size_type local_10a0;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1098;
  SpanContext local_1060;
  AssertHelper local_f90 [8];
  Message local_f88 [8];
  undefined1 local_f80 [8];
  AssertionResult gtest_ar_12;
  AssertHelper local_f50 [8];
  Message local_f48 [15];
  bool local_f39;
  undefined1 local_f38 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_f10 [8];
  Message local_f08 [8];
  undefined1 local_f00 [8];
  AssertionResult gtest_ar_11;
  AssertHelper local_ed0 [8];
  Message local_ec8 [15];
  bool local_eb9;
  undefined1 local_eb8 [8];
  AssertionResult gtest_ar__12;
  allocator local_e89;
  key_type local_e88;
  AssertHelper local_e68 [8];
  Message local_e60 [8];
  undefined1 local_e58 [8];
  AssertionResult gtest_ar_10;
  string local_e40;
  allocator local_e19;
  string local_e18;
  undefined1 local_df8 [8];
  SpanContext ctx;
  Message local_d20 [8];
  undefined1 local_d18 [8];
  AssertionResult gtest_ar_9;
  AssertHelper local_ce8 [8];
  Message local_ce0 [15];
  bool local_cd1;
  undefined1 local_cd0 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_ca0 [8];
  Message local_c98 [15];
  bool local_c89;
  undefined1 local_c88 [8];
  AssertionResult gtest_ar__10;
  expected<void,_std::error_code> local_c60;
  allocator local_c41;
  key_type local_c40;
  AssertHelper local_c20 [8];
  Message local_c18 [8];
  undefined1 local_c10 [8];
  AssertionResult gtest_ar_8;
  AssertHelper local_be0 [8];
  Message local_bd8 [15];
  bool local_bc9;
  undefined1 local_bc8 [8];
  AssertionResult gtest_ar__9;
  unique_ptr<const_jaegertracing::SpanContext,_std::default_delete<const_jaegertracing::SpanContext>_>
  extractedCtx_2;
  AssertHelper local_b90 [8];
  Message local_b88 [15];
  bool local_b79;
  undefined1 local_b78 [8];
  AssertionResult gtest_ar__8;
  expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
  result_2;
  ReaderMock<opentracing::v3::HTTPHeadersReader> headerReader;
  Message local_b38 [15];
  allocator local_b29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b08;
  undefined1 local_ae8 [8];
  AssertionResult gtest_ar_7;
  Message local_ad0 [15];
  allocator local_ac1;
  key_type local_ac0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_aa0;
  undefined1 local_a80 [8];
  AssertionResult gtest_ar_6;
  ostringstream oss_1;
  AssertHelper local_8f8 [8];
  Message local_8f0 [8];
  size_type local_8e8;
  int local_8dc;
  undefined1 local_8d8 [8];
  AssertionResult gtest_ar_5;
  AssertHelper local_8a8 [8];
  Message local_8a0 [8];
  expected<void,_std::error_code> local_898;
  bool local_879;
  undefined1 local_878 [8];
  AssertionResult gtest_ar__7;
  WriterMock<opentracing::v3::HTTPHeadersWriter> headerWriter;
  StrMap headerMap;
  Message local_818 [8];
  undefined1 local_810 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_7e0 [8];
  Message local_7d8 [15];
  bool local_7c9;
  undefined1 local_7c8 [8];
  AssertionResult gtest_ar__6;
  unique_ptr<const_jaegertracing::SpanContext,_std::default_delete<const_jaegertracing::SpanContext>_>
  extractedCtx_1;
  AssertHelper local_790 [8];
  Message local_788 [15];
  bool local_779;
  undefined1 local_778 [8];
  AssertionResult gtest_ar__5;
  expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
  result_1;
  ReaderMock<opentracing::v3::TextMapReader> textReader;
  Message local_738 [15];
  allocator local_729;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_728;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_708;
  undefined1 local_6e8 [8];
  AssertionResult gtest_ar_3;
  Message local_6d0 [15];
  allocator local_6c1;
  key_type local_6c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a0;
  undefined1 local_680 [8];
  AssertionResult gtest_ar_2;
  ostringstream oss;
  AssertHelper local_4f8 [8];
  Message local_4f0 [8];
  size_type local_4e8;
  int local_4dc;
  undefined1 local_4d8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_4a8 [8];
  Message local_4a0 [8];
  expected<void,_std::error_code> local_498;
  bool local_479;
  undefined1 local_478 [8];
  AssertionResult gtest_ar__4;
  WriterMock<opentracing::v3::TextMapWriter> textWriter;
  StrMap textMap;
  AssertHelper local_400 [8];
  Message local_3f8 [8];
  expected<void,_std::error_code> local_3f0;
  bool local_3d1;
  undefined1 local_3d0 [8];
  AssertionResult gtest_ar__3;
  string local_3b8 [32];
  FakeSpanContext local_398;
  FakeSpanContext fakeCtx;
  Message local_388 [8];
  undefined1 local_380 [8];
  AssertionResult gtest_ar;
  AssertHelper local_350 [8];
  Message local_348 [15];
  bool local_339;
  undefined1 local_338 [8];
  AssertionResult gtest_ar__2;
  unique_ptr<const_jaegertracing::SpanContext,_std::default_delete<const_jaegertracing::SpanContext>_>
  extractedCtx;
  AssertHelper local_300 [8];
  Message local_2f8 [15];
  bool local_2e9;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar__1;
  expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
  result;
  AssertionResult local_2b8 [2];
  AssertHelper local_298 [8];
  Message local_290 [8];
  expected<void,_std::error_code> local_288;
  bool local_269;
  undefined1 local_268 [8];
  AssertionResult gtest_ar_;
  stringstream ss;
  undefined1 local_248 [376];
  string_view local_d0;
  string_view local_c0 [2];
  StartSpanOptions local_a0;
  string_view local_60;
  unique_ptr<opentracing::v3::Span,_std::default_delete<opentracing::v3::Span>_> local_50;
  unique_ptr<jaegertracing::Span,_std::default_delete<jaegertracing::Span>_> local_48;
  unique_ptr<jaegertracing::Span,_std::default_delete<jaegertracing::Span>_> span;
  undefined1 local_30 [8];
  shared_ptr<jaegertracing::Tracer> tracer;
  shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle> handle;
  Tracer_testPropagation_Test *this_local;
  
  jaegertracing::testutils::TracerUtil::installGlobalTracer();
  opentracing::v3::Tracer::Global();
  std::static_pointer_cast<jaegertracing::Tracer,opentracing::v3::Tracer>
            ((shared_ptr<opentracing::v3::Tracer> *)local_30);
  std::shared_ptr<opentracing::v3::Tracer>::~shared_ptr
            ((shared_ptr<opentracing::v3::Tracer> *)&span);
  peVar3 = std::__shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
  opentracing::v3::string_view::string_view(&local_60,"test-inject");
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&local_a0.start_system_timestamp);
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&local_a0.start_steady_timestamp);
  local_a0.references.
  super__Vector_base<std::pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*>,_std::allocator<std::pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a0.references.
  super__Vector_base<std::pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*>,_std::allocator<std::pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0.references.
  super__Vector_base<std::pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*>,_std::allocator<std::pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*>,_std::allocator<std::pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*>_>_>
  ::vector(&local_a0.references);
  local_a0.tags.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a0.tags.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0.tags.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>
  ::vector(&local_a0.tags);
  (**(code **)(*(long *)peVar3 + 0x10))(&local_50,peVar3,local_60.data_,local_60.length_);
  pSVar4 = (pointer)std::
                    unique_ptr<opentracing::v3::Span,_std::default_delete<opentracing::v3::Span>_>::
                    release(&local_50);
  std::unique_ptr<jaegertracing::Span,std::default_delete<jaegertracing::Span>>::
  unique_ptr<std::default_delete<jaegertracing::Span>,void>
            ((unique_ptr<jaegertracing::Span,std::default_delete<jaegertracing::Span>> *)&local_48,
             pSVar4);
  std::unique_ptr<opentracing::v3::Span,_std::default_delete<opentracing::v3::Span>_>::~unique_ptr
            (&local_50);
  opentracing::v3::StartSpanOptions::~StartSpanOptions(&local_a0);
  pSVar4 = std::unique_ptr<jaegertracing::Span,_std::default_delete<jaegertracing::Span>_>::
           operator->(&local_48);
  opentracing::v3::string_view::string_view(local_c0,"test-baggage-item-key");
  opentracing::v3::string_view::string_view(&local_d0,"test baggage item value");
  (**(code **)(*(long *)pSVar4 + 0x28))
            (pSVar4,local_c0[0].data_,local_c0[0].length_,local_d0.data_,local_d0.length_);
  std::__cxx11::stringstream::stringstream((stringstream *)&gtest_ar_.message_);
  peVar3 = std::__shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
  pSVar4 = std::unique_ptr<jaegertracing::Span,_std::default_delete<jaegertracing::Span>_>::
           operator->(&local_48);
  uVar5 = (**(code **)(*(long *)pSVar4 + 0x50))();
  (**(code **)(*(long *)peVar3 + 0x18))(&local_288,peVar3,uVar5,local_248);
  local_269 = opentracing::v3::expected::operator_cast_to_bool((expected *)&local_288);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_268,&local_269,(type *)0x0);
  opentracing::v3::expected<void,_std::error_code>::~expected(&local_288);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
  if (!bVar1) {
    testing::Message::Message(local_290);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_2b8,local_268,"static_cast<bool>(tracer->Inject(span->context(), ss))","false")
    ;
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_298,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
               ,0x15d,pcVar6);
    testing::internal::AssertHelper::operator=(local_298,local_290);
    testing::internal::AssertHelper::~AssertHelper(local_298);
    std::__cxx11::string::~string((string *)local_2b8);
    testing::Message::~Message(local_290);
  }
  bVar1 = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
  if (!bVar1) {
    peVar3 = std::
             __shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
    (**(code **)(*(long *)peVar3 + 0x38))(&gtest_ar__1.message_,peVar3,&gtest_ar_.message_);
    local_2e9 = opentracing::v3::expected::operator_cast_to_bool((expected *)&gtest_ar__1.message_);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_2e8,&local_2e9,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
    if (!bVar1) {
      testing::Message::Message(local_2f8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)&extractedCtx,local_2e8,"static_cast<bool>(result)","false");
      pcVar6 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (local_300,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                 ,0x15f,pcVar6);
      testing::internal::AssertHelper::operator=(local_300,local_2f8);
      testing::internal::AssertHelper::~AssertHelper(local_300);
      std::__cxx11::string::~string((string *)&extractedCtx);
      testing::Message::~Message(local_2f8);
    }
    bVar1 = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
    if (!bVar1) {
      pvVar7 = opentracing::v3::
               expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
               ::operator->((expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                             *)&gtest_ar__1.message_);
      pSVar8 = (pointer)std::
                        unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                        ::release(pvVar7);
      std::
      unique_ptr<jaegertracing::SpanContext_const,std::default_delete<jaegertracing::SpanContext_const>>
      ::unique_ptr<std::default_delete<jaegertracing::SpanContext_const>,void>
                ((unique_ptr<jaegertracing::SpanContext_const,std::default_delete<jaegertracing::SpanContext_const>>
                  *)&gtest_ar__2.message_,pSVar8);
      local_339 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&gtest_ar__2.message_);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_338,&local_339,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_338);
      if (!bVar1) {
        testing::Message::Message(local_348);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((AssertionResult *)&gtest_ar.message_,local_338,"static_cast<bool>(extractedCtx)"
                   ,"false");
        pcVar6 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (local_350,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                   ,0x162,pcVar6);
        testing::internal::AssertHelper::operator=(local_350,local_348);
        testing::internal::AssertHelper::~AssertHelper(local_350);
        std::__cxx11::string::~string((string *)&gtest_ar.message_);
        testing::Message::~Message(local_348);
      }
      bVar1 = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
      if (!bVar1) {
        pSVar4 = std::unique_ptr<jaegertracing::Span,_std::default_delete<jaegertracing::Span>_>::
                 operator->(&local_48);
        pSVar9 = (SpanContext *)(**(code **)(*(long *)pSVar4 + 0x50))();
        pSVar10 = std::
                  unique_ptr<const_jaegertracing::SpanContext,_std::default_delete<const_jaegertracing::SpanContext>_>
                  ::operator*((unique_ptr<const_jaegertracing::SpanContext,_std::default_delete<const_jaegertracing::SpanContext>_>
                               *)&gtest_ar__2.message_);
        testing::internal::EqHelper<false>::
        Compare<jaegertracing::SpanContext,jaegertracing::SpanContext>
                  ((EqHelper<false> *)local_380,"span->context()","*extractedCtx",pSVar9,pSVar10);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_380);
        if (!bVar1) {
          testing::Message::Message(local_388);
          pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_380);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&fakeCtx,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                     ,0x163,pcVar6);
          testing::internal::AssertHelper::operator=((AssertHelper *)&fakeCtx,local_388);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fakeCtx);
          testing::Message::~Message(local_388);
        }
        bVar1 = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
        if (!bVar1) {
          anon_unknown_16::FakeSpanContext::FakeSpanContext(&local_398);
          std::ios::clear((long)&gtest_ar_.message_.ptr_ +
                          gtest_ar_.message_.ptr_[-1]._M_string_length,0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_3b8,"",(allocator *)((long)&gtest_ar__3.message_.ptr_ + 7));
          std::__cxx11::stringstream::str((string *)&gtest_ar_.message_);
          std::__cxx11::string::~string(local_3b8);
          std::allocator<char>::~allocator
                    ((allocator<char> *)((long)&gtest_ar__3.message_.ptr_ + 7));
          peVar3 = std::
                   __shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_30);
          (**(code **)(*(long *)peVar3 + 0x18))(&local_3f0,peVar3,&local_398,local_248);
          local_3d1 = opentracing::v3::expected::operator_cast_to_bool((expected *)&local_3f0);
          local_3d1 = !local_3d1;
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_3d0,&local_3d1,(type *)0x0);
          opentracing::v3::expected<void,_std::error_code>::~expected(&local_3f0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d0);
          if (!bVar1) {
            testing::Message::Message(local_3f8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((AssertionResult *)&textMap._M_h._M_single_bucket,local_3d0,
                       "static_cast<bool>(tracer->Inject(fakeCtx, ss))","true");
            pcVar6 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (local_400,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                       ,0x167,pcVar6);
            testing::internal::AssertHelper::operator=(local_400,local_3f8);
            testing::internal::AssertHelper::~AssertHelper(local_400);
            std::__cxx11::string::~string((string *)&textMap._M_h._M_single_bucket);
            testing::Message::~Message(local_3f8);
          }
          bVar1 = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d0);
          anon_unknown_16::FakeSpanContext::~FakeSpanContext(&local_398);
        }
      }
      std::
      unique_ptr<const_jaegertracing::SpanContext,_std::default_delete<const_jaegertracing::SpanContext>_>
      ::~unique_ptr((unique_ptr<const_jaegertracing::SpanContext,_std::default_delete<const_jaegertracing::SpanContext>_>
                     *)&gtest_ar__2.message_);
    }
    opentracing::v3::
    expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
    ::~expected((expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                 *)&gtest_ar__1.message_);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&gtest_ar_.message_);
  if (!bVar1) {
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&textWriter._keyValuePairs);
    anon_unknown_16::WriterMock<opentracing::v3::TextMapWriter>::WriterMock
              ((WriterMock<opentracing::v3::TextMapWriter> *)&gtest_ar__4.message_,
               (StrMap *)&textWriter._keyValuePairs);
    peVar3 = std::
             __shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
    pSVar4 = std::unique_ptr<jaegertracing::Span,_std::default_delete<jaegertracing::Span>_>::
             operator->(&local_48);
    uVar5 = (**(code **)(*(long *)pSVar4 + 0x50))();
    (**(code **)(*(long *)peVar3 + 0x20))(&local_498,peVar3,uVar5,&gtest_ar__4.message_);
    local_479 = opentracing::v3::expected::operator_cast_to_bool((expected *)&local_498);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_478,&local_479,(type *)0x0);
    opentracing::v3::expected<void,_std::error_code>::~expected(&local_498);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_478);
    if (!bVar1) {
      testing::Message::Message(local_4a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)&gtest_ar_1.message_,local_478,
                 "static_cast<bool>(tracer->Inject(span->context(), textWriter))","false");
      pcVar6 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (local_4a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                 ,0x16f,pcVar6);
      testing::internal::AssertHelper::operator=(local_4a8,local_4a0);
      testing::internal::AssertHelper::~AssertHelper(local_4a8);
      std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
      testing::Message::~Message(local_4a0);
    }
    bVar1 = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_478);
    if (!bVar1) {
      local_4dc = 2;
      local_4e8 = std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::size((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&textWriter._keyValuePairs);
      testing::internal::EqHelper<false>::Compare<int,unsigned_long>
                ((EqHelper<false> *)local_4d8,"2","textMap.size()",&local_4dc,&local_4e8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d8);
      if (!bVar1) {
        testing::Message::Message(local_4f0);
        pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_4d8);
        testing::internal::AssertHelper::AssertHelper
                  (local_4f8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                   ,0x170,pcVar6);
        testing::internal::AssertHelper::operator=(local_4f8,local_4f0);
        testing::internal::AssertHelper::~AssertHelper(local_4f8);
        testing::Message::~Message(local_4f0);
      }
      bVar1 = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d8);
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&gtest_ar_2.message_);
        pSVar4 = std::unique_ptr<jaegertracing::Span,_std::default_delete<jaegertracing::Span>_>::
                 operator->(&local_48);
        pSVar9 = (SpanContext *)(**(code **)(*(long *)pSVar4 + 0x50))();
        ::operator<<((ostream *)&gtest_ar_2.message_,pSVar9);
        std::__cxx11::ostringstream::str();
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_6c0,"uber-trace-id",&local_6c1);
        pmVar11 = std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&textWriter._keyValuePairs,&local_6c0);
        testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
                  ((EqHelper<false> *)local_680,"oss.str()","textMap.at(kTraceContextHeaderName)",
                   &local_6a0,pmVar11);
        std::__cxx11::string::~string((string *)&local_6c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_6c1);
        std::__cxx11::string::~string((string *)&local_6a0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_680);
        if (!bVar1) {
          testing::Message::Message(local_6d0);
          pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_680);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                     ,0x173,pcVar6);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_6d0)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
          testing::Message::~Message(local_6d0);
        }
        bVar1 = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_680);
        if (!bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_728,"uberctx-",&local_729);
          std::operator+(&local_708,&local_728,"test-baggage-item-key");
          pmVar11 = std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&textWriter._keyValuePairs,&local_708);
          testing::internal::EqHelper<false>::Compare<char[24],std::__cxx11::string>
                    ((EqHelper<false> *)local_6e8,"\"test baggage item value\"",
                     "textMap.at(std::string(kTraceBaggageHeaderPrefix) + \"test-baggage-item-key\")"
                     ,(char (*) [24])"test baggage item value",pmVar11);
          std::__cxx11::string::~string((string *)&local_708);
          std::__cxx11::string::~string((string *)&local_728);
          std::allocator<char>::~allocator((allocator<char> *)&local_729);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6e8);
          if (!bVar1) {
            testing::Message::Message(local_738);
            pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_6e8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&textReader._keyValuePairs,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                       ,0x176,pcVar6);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&textReader._keyValuePairs,local_738);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)&textReader._keyValuePairs);
            testing::Message::~Message(local_738);
          }
          bVar1 = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_6e8);
          if (!bVar1) {
            anon_unknown_16::ReaderMock<opentracing::v3::TextMapReader>::ReaderMock
                      ((ReaderMock<opentracing::v3::TextMapReader> *)((long)&result_1.contained + 8)
                       ,(StrMap *)&textWriter._keyValuePairs);
            peVar3 = std::
                     __shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_30);
            (**(code **)(*(long *)peVar3 + 0x40))
                      (&gtest_ar__5.message_,peVar3,(undefined1 *)((long)&result_1.contained + 8));
            local_779 = opentracing::v3::expected::operator_cast_to_bool
                                  ((expected *)&gtest_ar__5.message_);
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_778,&local_779,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_778);
            if (!bVar1) {
              testing::Message::Message(local_788);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((AssertionResult *)&extractedCtx_1,local_778,"static_cast<bool>(result)",
                         "false");
              pcVar6 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (local_790,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                         ,0x179,pcVar6);
              testing::internal::AssertHelper::operator=(local_790,local_788);
              testing::internal::AssertHelper::~AssertHelper(local_790);
              std::__cxx11::string::~string((string *)&extractedCtx_1);
              testing::Message::~Message(local_788);
            }
            bVar1 = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_778);
            if (!bVar1) {
              pvVar7 = opentracing::v3::
                       expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                       ::operator->((expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                                     *)&gtest_ar__5.message_);
              pSVar8 = (pointer)std::
                                unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                                ::release(pvVar7);
              std::
              unique_ptr<jaegertracing::SpanContext_const,std::default_delete<jaegertracing::SpanContext_const>>
              ::unique_ptr<std::default_delete<jaegertracing::SpanContext_const>,void>
                        ((unique_ptr<jaegertracing::SpanContext_const,std::default_delete<jaegertracing::SpanContext_const>>
                          *)&gtest_ar__6.message_,pSVar8);
              local_7c9 = std::unique_ptr::operator_cast_to_bool
                                    ((unique_ptr *)&gtest_ar__6.message_);
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_7c8,&local_7c9,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7c8);
              if (!bVar1) {
                testing::Message::Message(local_7d8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((AssertionResult *)&gtest_ar_4.message_,local_7c8,
                           "static_cast<bool>(extractedCtx)","false");
                pcVar6 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (local_7e0,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                           ,0x17c,pcVar6);
                testing::internal::AssertHelper::operator=(local_7e0,local_7d8);
                testing::internal::AssertHelper::~AssertHelper(local_7e0);
                std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
                testing::Message::~Message(local_7d8);
              }
              bVar1 = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_7c8);
              if (!bVar1) {
                pSVar4 = std::
                         unique_ptr<jaegertracing::Span,_std::default_delete<jaegertracing::Span>_>
                         ::operator->(&local_48);
                pSVar9 = (SpanContext *)(**(code **)(*(long *)pSVar4 + 0x50))();
                pSVar10 = std::
                          unique_ptr<const_jaegertracing::SpanContext,_std::default_delete<const_jaegertracing::SpanContext>_>
                          ::operator*((unique_ptr<const_jaegertracing::SpanContext,_std::default_delete<const_jaegertracing::SpanContext>_>
                                       *)&gtest_ar__6.message_);
                testing::internal::EqHelper<false>::
                Compare<jaegertracing::SpanContext,jaegertracing::SpanContext>
                          ((EqHelper<false> *)local_810,"span->context()","*extractedCtx",pSVar9,
                           pSVar10);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_810);
                if (!bVar1) {
                  testing::Message::Message(local_818);
                  pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_810);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&headerMap._M_h._M_single_bucket,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                             ,0x17d,pcVar6);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&headerMap._M_h._M_single_bucket,local_818);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&headerMap._M_h._M_single_bucket);
                  testing::Message::~Message(local_818);
                }
                bVar1 = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_810);
                if (!bVar1) {
                  bVar1 = false;
                }
              }
              std::
              unique_ptr<const_jaegertracing::SpanContext,_std::default_delete<const_jaegertracing::SpanContext>_>
              ::~unique_ptr((unique_ptr<const_jaegertracing::SpanContext,_std::default_delete<const_jaegertracing::SpanContext>_>
                             *)&gtest_ar__6.message_);
            }
            opentracing::v3::
            expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
            ::~expected((expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                         *)&gtest_ar__5.message_);
            anon_unknown_16::ReaderMock<opentracing::v3::TextMapReader>::~ReaderMock
                      ((ReaderMock<opentracing::v3::TextMapReader> *)((long)&result_1.contained + 8)
                      );
          }
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&gtest_ar_2.message_);
      }
    }
    anon_unknown_16::WriterMock<opentracing::v3::TextMapWriter>::~WriterMock
              ((WriterMock<opentracing::v3::TextMapWriter> *)&gtest_ar__4.message_);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&textWriter._keyValuePairs);
    if (!bVar1) {
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&headerWriter._keyValuePairs);
      anon_unknown_16::WriterMock<opentracing::v3::HTTPHeadersWriter>::WriterMock
                ((WriterMock<opentracing::v3::HTTPHeadersWriter> *)&gtest_ar__7.message_,
                 (StrMap *)&headerWriter._keyValuePairs);
      peVar3 = std::
               __shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_30);
      pSVar4 = std::unique_ptr<jaegertracing::Span,_std::default_delete<jaegertracing::Span>_>::
               operator->(&local_48);
      uVar5 = (**(code **)(*(long *)pSVar4 + 0x50))();
      (**(code **)(*(long *)peVar3 + 0x28))(&local_898,peVar3,uVar5,&gtest_ar__7.message_);
      local_879 = opentracing::v3::expected::operator_cast_to_bool((expected *)&local_898);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_878,&local_879,(type *)0x0);
      opentracing::v3::expected<void,_std::error_code>::~expected(&local_898);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_878);
      if (!bVar1) {
        testing::Message::Message(local_8a0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((AssertionResult *)&gtest_ar_5.message_,local_878,
                   "static_cast<bool>(tracer->Inject(span->context(), headerWriter))","false");
        pcVar6 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (local_8a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                   ,0x185,pcVar6);
        testing::internal::AssertHelper::operator=(local_8a8,local_8a0);
        testing::internal::AssertHelper::~AssertHelper(local_8a8);
        std::__cxx11::string::~string((string *)&gtest_ar_5.message_);
        testing::Message::~Message(local_8a0);
      }
      bVar1 = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_878);
      if (!bVar1) {
        local_8dc = 2;
        local_8e8 = std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::size((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&headerWriter._keyValuePairs);
        testing::internal::EqHelper<false>::Compare<int,unsigned_long>
                  ((EqHelper<false> *)local_8d8,"2","headerMap.size()",&local_8dc,&local_8e8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8d8);
        if (!bVar1) {
          testing::Message::Message(local_8f0);
          pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_8d8);
          testing::internal::AssertHelper::AssertHelper
                    (local_8f8,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                     ,0x186,pcVar6);
          testing::internal::AssertHelper::operator=(local_8f8,local_8f0);
          testing::internal::AssertHelper::~AssertHelper(local_8f8);
          testing::Message::~Message(local_8f0);
        }
        bVar1 = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_8d8);
        if (!bVar1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&gtest_ar_6.message_);
          pSVar4 = std::unique_ptr<jaegertracing::Span,_std::default_delete<jaegertracing::Span>_>::
                   operator->(&local_48);
          pSVar9 = (SpanContext *)(**(code **)(*(long *)pSVar4 + 0x50))();
          ::operator<<((ostream *)&gtest_ar_6.message_,pSVar9);
          std::__cxx11::ostringstream::str();
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_ac0,"uber-trace-id",&local_ac1);
          pmVar11 = std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&headerWriter._keyValuePairs,&local_ac0);
          testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
                    ((EqHelper<false> *)local_a80,"oss.str()",
                     "headerMap.at(kTraceContextHeaderName)",&local_aa0,pmVar11);
          std::__cxx11::string::~string((string *)&local_ac0);
          std::allocator<char>::~allocator((allocator<char> *)&local_ac1);
          std::__cxx11::string::~string((string *)&local_aa0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a80);
          if (!bVar1) {
            testing::Message::Message(local_ad0);
            pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_a80);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_7.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                       ,0x189,pcVar6);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_7.message_,local_ad0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
            testing::Message::~Message(local_ad0);
          }
          bVar1 = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_a80);
          if (!bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_b28,"uberctx-",&local_b29);
            std::operator+(&local_b08,&local_b28,"test-baggage-item-key");
            pmVar11 = std::
                      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&headerWriter._keyValuePairs,&local_b08);
            testing::internal::EqHelper<false>::Compare<char[30],std::__cxx11::string>
                      ((EqHelper<false> *)local_ae8,"\"test%20baggage%20item%20value\"",
                       "headerMap.at(std::string(kTraceBaggageHeaderPrefix) + \"test-baggage-item-key\")"
                       ,(char (*) [30])"test%20baggage%20item%20value",pmVar11);
            std::__cxx11::string::~string((string *)&local_b08);
            std::__cxx11::string::~string((string *)&local_b28);
            std::allocator<char>::~allocator((allocator<char> *)&local_b29);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ae8);
            if (!bVar1) {
              testing::Message::Message(local_b38);
              pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_ae8);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&headerReader._keyValuePairs,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                         ,0x18c,pcVar6);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&headerReader._keyValuePairs,local_b38);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)&headerReader._keyValuePairs);
              testing::Message::~Message(local_b38);
            }
            bVar1 = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_ae8);
            if (!bVar1) {
              anon_unknown_16::ReaderMock<opentracing::v3::HTTPHeadersReader>::ReaderMock
                        ((ReaderMock<opentracing::v3::HTTPHeadersReader> *)
                         ((long)&result_2.contained + 8),(StrMap *)&headerWriter._keyValuePairs);
              peVar3 = std::
                       __shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_30);
              (**(code **)(*(long *)peVar3 + 0x48))
                        (&gtest_ar__8.message_,peVar3,(undefined1 *)((long)&result_2.contained + 8))
              ;
              local_b79 = opentracing::v3::expected::operator_cast_to_bool
                                    ((expected *)&gtest_ar__8.message_);
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_b78,&local_b79,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b78);
              if (!bVar1) {
                testing::Message::Message(local_b88);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((AssertionResult *)&extractedCtx_2,local_b78,"static_cast<bool>(result)",
                           "false");
                pcVar6 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (local_b90,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                           ,399,pcVar6);
                testing::internal::AssertHelper::operator=(local_b90,local_b88);
                testing::internal::AssertHelper::~AssertHelper(local_b90);
                std::__cxx11::string::~string((string *)&extractedCtx_2);
                testing::Message::~Message(local_b88);
              }
              bVar1 = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_b78);
              if (!bVar1) {
                pvVar7 = opentracing::v3::
                         expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                         ::operator->((expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                                       *)&gtest_ar__8.message_);
                pSVar8 = (pointer)std::
                                  unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                                  ::release(pvVar7);
                std::
                unique_ptr<jaegertracing::SpanContext_const,std::default_delete<jaegertracing::SpanContext_const>>
                ::unique_ptr<std::default_delete<jaegertracing::SpanContext_const>,void>
                          ((unique_ptr<jaegertracing::SpanContext_const,std::default_delete<jaegertracing::SpanContext_const>>
                            *)&gtest_ar__9.message_,pSVar8);
                local_bc9 = std::unique_ptr::operator_cast_to_bool
                                      ((unique_ptr *)&gtest_ar__9.message_);
                testing::AssertionResult::AssertionResult<bool>
                          ((AssertionResult *)local_bc8,&local_bc9,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_bc8);
                if (!bVar1) {
                  testing::Message::Message(local_bd8);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((AssertionResult *)&gtest_ar_8.message_,local_bc8,
                             "static_cast<bool>(extractedCtx)","false");
                  pcVar6 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (local_be0,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                             ,0x192,pcVar6);
                  testing::internal::AssertHelper::operator=(local_be0,local_bd8);
                  testing::internal::AssertHelper::~AssertHelper(local_be0);
                  std::__cxx11::string::~string((string *)&gtest_ar_8.message_);
                  testing::Message::~Message(local_bd8);
                }
                bVar1 = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_bc8);
                if (!bVar1) {
                  pSVar4 = std::
                           unique_ptr<jaegertracing::Span,_std::default_delete<jaegertracing::Span>_>
                           ::operator->(&local_48);
                  pSVar9 = (SpanContext *)(**(code **)(*(long *)pSVar4 + 0x50))();
                  pSVar10 = std::
                            unique_ptr<const_jaegertracing::SpanContext,_std::default_delete<const_jaegertracing::SpanContext>_>
                            ::operator*((unique_ptr<const_jaegertracing::SpanContext,_std::default_delete<const_jaegertracing::SpanContext>_>
                                         *)&gtest_ar__9.message_);
                  testing::internal::EqHelper<false>::
                  Compare<jaegertracing::SpanContext,jaegertracing::SpanContext>
                            ((EqHelper<false> *)local_c10,"span->context()","*extractedCtx",pSVar9,
                             pSVar10);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_c10);
                  if (!bVar1) {
                    testing::Message::Message(local_c18);
                    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_c10)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              (local_c20,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                               ,0x193,pcVar6);
                    testing::internal::AssertHelper::operator=(local_c20,local_c18);
                    testing::internal::AssertHelper::~AssertHelper(local_c20);
                    testing::Message::~Message(local_c18);
                  }
                  bVar1 = !bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c10);
                  if (!bVar1) {
                    std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::clear((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&headerWriter._keyValuePairs);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string((string *)&local_c40,"jaeger-debug-id",&local_c41);
                    pmVar11 = std::
                              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                            *)&headerWriter._keyValuePairs,&local_c40);
                    std::__cxx11::string::operator=((string *)pmVar11,"yes");
                    std::__cxx11::string::~string((string *)&local_c40);
                    std::allocator<char>::~allocator((allocator<char> *)&local_c41);
                    peVar3 = std::
                             __shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)local_30);
                    pSVar4 = std::
                             unique_ptr<jaegertracing::Span,_std::default_delete<jaegertracing::Span>_>
                             ::operator->(&local_48);
                    uVar5 = (**(code **)(*(long *)pSVar4 + 0x50))();
                    (**(code **)(*(long *)peVar3 + 0x28))
                              (&local_c60,peVar3,uVar5,&gtest_ar__7.message_);
                    opentracing::v3::expected<void,_std::error_code>::~expected(&local_c60);
                    peVar3 = std::
                             __shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)local_30);
                    (**(code **)(*(long *)peVar3 + 0x48))
                              (&gtest_ar__10.message_,peVar3,
                               (undefined1 *)((long)&result_2.contained + 8));
                    opentracing::v3::
                    expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                    ::operator=((expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                                 *)&gtest_ar__8.message_,
                                (expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                                 *)&gtest_ar__10.message_);
                    opentracing::v3::
                    expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                    ::~expected((expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                                 *)&gtest_ar__10.message_);
                    local_c89 = opentracing::v3::expected::operator_cast_to_bool
                                          ((expected *)&gtest_ar__8.message_);
                    testing::AssertionResult::AssertionResult<bool>
                              ((AssertionResult *)local_c88,&local_c89,(type *)0x0);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_c88);
                    if (!bVar1) {
                      testing::Message::Message(local_c98);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((AssertionResult *)&gtest_ar__11.message_,local_c88,
                                 "static_cast<bool>(result)","false");
                      pcVar6 = (char *)std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (local_ca0,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                                 ,0x19a,pcVar6);
                      testing::internal::AssertHelper::operator=(local_ca0,local_c98);
                      testing::internal::AssertHelper::~AssertHelper(local_ca0);
                      std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
                      testing::Message::~Message(local_c98);
                    }
                    bVar1 = !bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_c88);
                    if (!bVar1) {
                      pvVar7 = opentracing::v3::
                               expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                               ::operator->((expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                                             *)&gtest_ar__8.message_);
                      pSVar8 = (pointer)std::
                                        unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                                        ::release(pvVar7);
                      std::
                      unique_ptr<const_jaegertracing::SpanContext,_std::default_delete<const_jaegertracing::SpanContext>_>
                      ::reset((unique_ptr<const_jaegertracing::SpanContext,_std::default_delete<const_jaegertracing::SpanContext>_>
                               *)&gtest_ar__9.message_,pSVar8);
                      local_cd1 = std::unique_ptr::operator_cast_to_bool
                                            ((unique_ptr *)&gtest_ar__9.message_);
                      testing::AssertionResult::AssertionResult<bool>
                                ((AssertionResult *)local_cd0,&local_cd1,(type *)0x0);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_cd0);
                      if (!bVar1) {
                        testing::Message::Message(local_ce0);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((AssertionResult *)&gtest_ar_9.message_,local_cd0,
                                   "static_cast<bool>(extractedCtx)","false");
                        pcVar6 = (char *)std::__cxx11::string::c_str();
                        testing::internal::AssertHelper::AssertHelper
                                  (local_ce8,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                                   ,0x19c,pcVar6);
                        testing::internal::AssertHelper::operator=(local_ce8,local_ce0);
                        testing::internal::AssertHelper::~AssertHelper(local_ce8);
                        std::__cxx11::string::~string((string *)&gtest_ar_9.message_);
                        testing::Message::~Message(local_ce0);
                      }
                      bVar1 = !bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_cd0);
                      if (!bVar1) {
                        pSVar4 = std::
                                 unique_ptr<jaegertracing::Span,_std::default_delete<jaegertracing::Span>_>
                                 ::operator->(&local_48);
                        pSVar9 = (SpanContext *)(**(code **)(*(long *)pSVar4 + 0x50))();
                        pSVar10 = std::
                                  unique_ptr<const_jaegertracing::SpanContext,_std::default_delete<const_jaegertracing::SpanContext>_>
                                  ::operator*((unique_ptr<const_jaegertracing::SpanContext,_std::default_delete<const_jaegertracing::SpanContext>_>
                                               *)&gtest_ar__9.message_);
                        testing::internal::
                        CmpHelperNE<jaegertracing::SpanContext,jaegertracing::SpanContext>
                                  ((internal *)local_d18,"span->context()","*extractedCtx",pSVar9,
                                   pSVar10);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_d18);
                        if (!bVar1) {
                          testing::Message::Message(local_d20);
                          pcVar6 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)local_d18);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)
                                     &ctx._mutex.super___mutex_base._M_mutex.__data.__list.__next,
                                     kFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                                     ,0x19d,pcVar6);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)
                                     &ctx._mutex.super___mutex_base._M_mutex.__data.__list.__next,
                                     local_d20);
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)
                                     &ctx._mutex.super___mutex_base._M_mutex.__data.__list.__next);
                          testing::Message::~Message(local_d20);
                        }
                        bVar1 = !bVar1;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_d18);
                        if (!bVar1) {
                          pSVar4 = std::
                                   unique_ptr<jaegertracing::Span,_std::default_delete<jaegertracing::Span>_>
                                   ::operator->(&local_48);
                          pSVar9 = (SpanContext *)(**(code **)(*(long *)pSVar4 + 0x50))();
                          pTVar12 = SpanContext::traceID(pSVar9);
                          pSVar4 = std::
                                   unique_ptr<jaegertracing::Span,_std::default_delete<jaegertracing::Span>_>
                                   ::operator->(&local_48);
                          pSVar9 = (SpanContext *)(**(code **)(*(long *)pSVar4 + 0x50))();
                          uVar13 = SpanContext::spanID(pSVar9);
                          pSVar4 = std::
                                   unique_ptr<jaegertracing::Span,_std::default_delete<jaegertracing::Span>_>
                                   ::operator->(&local_48);
                          pSVar9 = (SpanContext *)(**(code **)(*(long *)pSVar4 + 0x50))();
                          uVar14 = SpanContext::parentID(pSVar9);
                          pSVar4 = std::
                                   unique_ptr<jaegertracing::Span,_std::default_delete<jaegertracing::Span>_>
                                   ::operator->(&local_48);
                          pSVar9 = (SpanContext *)(**(code **)(*(long *)pSVar4 + 0x50))();
                          bVar2 = SpanContext::flags(pSVar9);
                          pSVar4 = std::
                                   unique_ptr<jaegertracing::Span,_std::default_delete<jaegertracing::Span>_>
                                   ::operator->(&local_48);
                          pSVar9 = (SpanContext *)(**(code **)(*(long *)pSVar4 + 0x50))();
                          pSVar15 = SpanContext::baggage_abi_cxx11_(pSVar9);
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string((string *)&local_e18,"yes",&local_e19);
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string
                                    ((string *)&local_e40,"",
                                     (allocator *)((long)&gtest_ar_10.message_.ptr_ + 7));
                          SpanContext::SpanContext
                                    ((SpanContext *)local_df8,pTVar12,uVar13,uVar14,bVar2 | 2,
                                     pSVar15,&local_e18,&local_e40);
                          std::__cxx11::string::~string((string *)&local_e40);
                          std::allocator<char>::~allocator
                                    ((allocator<char> *)((long)&gtest_ar_10.message_.ptr_ + 7));
                          std::__cxx11::string::~string((string *)&local_e18);
                          std::allocator<char>::~allocator((allocator<char> *)&local_e19);
                          pSVar10 = std::
                                    unique_ptr<const_jaegertracing::SpanContext,_std::default_delete<const_jaegertracing::SpanContext>_>
                                    ::operator*((unique_ptr<const_jaegertracing::SpanContext,_std::default_delete<const_jaegertracing::SpanContext>_>
                                                 *)&gtest_ar__9.message_);
                          testing::internal::EqHelper<false>::
                          Compare<jaegertracing::SpanContext,jaegertracing::SpanContext>
                                    ((EqHelper<false> *)local_e58,"ctx","*extractedCtx",
                                     (SpanContext *)local_df8,pSVar10);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_e58);
                          if (!bVar1) {
                            testing::Message::Message(local_e60);
                            pcVar6 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)local_e58);
                            testing::internal::AssertHelper::AssertHelper
                                      (local_e68,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                                       ,0x1a6,pcVar6);
                            testing::internal::AssertHelper::operator=(local_e68,local_e60);
                            testing::internal::AssertHelper::~AssertHelper(local_e68);
                            testing::Message::~Message(local_e60);
                          }
                          bVar1 = !bVar1;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_e58);
                          if (!bVar1) {
                            std::
                            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::clear((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&headerWriter._keyValuePairs);
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string
                                      ((string *)&local_e88,"uber-trace-id",&local_e89);
                            pmVar11 = std::
                                      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      ::operator[]((
                                                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)&headerWriter._keyValuePairs,&local_e88);
                            std::__cxx11::string::operator=((string *)pmVar11,"12345678");
                            std::__cxx11::string::~string((string *)&local_e88);
                            std::allocator<char>::~allocator((allocator<char> *)&local_e89);
                            peVar3 = std::
                                     __shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     ::operator->((
                                                  __shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)local_30);
                            (**(code **)(*(long *)peVar3 + 0x48))
                                      (&gtest_ar__12.message_,peVar3,
                                       (undefined1 *)((long)&result_2.contained + 8));
                            opentracing::v3::
                            expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                            ::operator=((expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                                         *)&gtest_ar__8.message_,
                                        (expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                                         *)&gtest_ar__12.message_);
                            opentracing::v3::
                            expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                            ::~expected((expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                                         *)&gtest_ar__12.message_);
                            local_eb9 = opentracing::v3::expected::operator_cast_to_bool
                                                  ((expected *)&gtest_ar__8.message_);
                            testing::AssertionResult::AssertionResult<bool>
                                      ((AssertionResult *)local_eb8,&local_eb9,(type *)0x0);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_eb8);
                            if (!bVar1) {
                              testing::Message::Message(local_ec8);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((AssertionResult *)&gtest_ar_11.message_,local_eb8,
                                         "static_cast<bool>(result)","false");
                              pcVar6 = (char *)std::__cxx11::string::c_str();
                              testing::internal::AssertHelper::AssertHelper
                                        (local_ed0,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                                         ,0x1ac,pcVar6);
                              testing::internal::AssertHelper::operator=(local_ed0,local_ec8);
                              testing::internal::AssertHelper::~AssertHelper(local_ed0);
                              std::__cxx11::string::~string((string *)&gtest_ar_11.message_);
                              testing::Message::~Message(local_ec8);
                            }
                            bVar1 = !bVar1;
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_eb8)
                            ;
                            if (!bVar1) {
                              pvVar7 = opentracing::v3::
                                       expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                                       ::operator->((
                                                  expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                                                  *)&gtest_ar__8.message_);
                              pSVar8 = (pointer)std::
                                                unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                                                ::release(pvVar7);
                              std::
                              unique_ptr<const_jaegertracing::SpanContext,_std::default_delete<const_jaegertracing::SpanContext>_>
                              ::reset((unique_ptr<const_jaegertracing::SpanContext,_std::default_delete<const_jaegertracing::SpanContext>_>
                                       *)&gtest_ar__9.message_,pSVar8);
                              pSVar8 = std::
                                       unique_ptr<const_jaegertracing::SpanContext,_std::default_delete<const_jaegertracing::SpanContext>_>
                                       ::get((unique_ptr<const_jaegertracing::SpanContext,_std::default_delete<const_jaegertracing::SpanContext>_>
                                              *)&gtest_ar__9.message_);
                              testing::internal::EqHelper<true>::
                              Compare<jaegertracing::SpanContext_const>
                                        ((EqHelper<true> *)local_f00,"nullptr","extractedCtx.get()",
                                         (Secret *)0x0,pSVar8);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_f00);
                              if (!bVar1) {
                                testing::Message::Message(local_f08);
                                pcVar6 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_f00);
                                testing::internal::AssertHelper::AssertHelper
                                          (local_f10,kFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                                           ,0x1ae,pcVar6);
                                testing::internal::AssertHelper::operator=(local_f10,local_f08);
                                testing::internal::AssertHelper::~AssertHelper(local_f10);
                                testing::Message::~Message(local_f08);
                              }
                              bVar1 = !bVar1;
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_f00);
                              if (!bVar1) {
                                std::
                                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ::clear((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&headerWriter._keyValuePairs);
                                peVar3 = std::
                                         __shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         ::operator->((
                                                  __shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)local_30);
                                (**(code **)(*(long *)peVar3 + 0x48))
                                          (&gtest_ar__13.message_,peVar3,
                                           (undefined1 *)((long)&result_2.contained + 8));
                                opentracing::v3::
                                expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                                ::operator=((expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                                             *)&gtest_ar__8.message_,
                                            (expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                                             *)&gtest_ar__13.message_);
                                opentracing::v3::
                                expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                                ::~expected((expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                                             *)&gtest_ar__13.message_);
                                local_f39 = opentracing::v3::expected::operator_cast_to_bool
                                                      ((expected *)&gtest_ar__8.message_);
                                testing::AssertionResult::AssertionResult<bool>
                                          ((AssertionResult *)local_f38,&local_f39,(type *)0x0);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_f38);
                                if (!bVar1) {
                                  testing::Message::Message(local_f48);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((AssertionResult *)&gtest_ar_12.message_,local_f38,
                                             "static_cast<bool>(result)","false");
                                  pcVar6 = (char *)std::__cxx11::string::c_str();
                                  testing::internal::AssertHelper::AssertHelper
                                            (local_f50,kFatalFailure,
                                             "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                                             ,0x1b3,pcVar6);
                                  testing::internal::AssertHelper::operator=(local_f50,local_f48);
                                  testing::internal::AssertHelper::~AssertHelper(local_f50);
                                  std::__cxx11::string::~string((string *)&gtest_ar_12.message_);
                                  testing::Message::~Message(local_f48);
                                }
                                bVar1 = !bVar1;
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_f38);
                                if (!bVar1) {
                                  pvVar7 = opentracing::v3::
                                           expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                                           ::operator->((
                                                  expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                                                  *)&gtest_ar__8.message_);
                                  pSVar8 = (pointer)std::
                                                  unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                                                  ::release(pvVar7);
                                  std::
                                  unique_ptr<const_jaegertracing::SpanContext,_std::default_delete<const_jaegertracing::SpanContext>_>
                                  ::reset((unique_ptr<const_jaegertracing::SpanContext,_std::default_delete<const_jaegertracing::SpanContext>_>
                                           *)&gtest_ar__9.message_,pSVar8);
                                  pSVar8 = std::
                                           unique_ptr<const_jaegertracing::SpanContext,_std::default_delete<const_jaegertracing::SpanContext>_>
                                           ::get((unique_ptr<const_jaegertracing::SpanContext,_std::default_delete<const_jaegertracing::SpanContext>_>
                                                  *)&gtest_ar__9.message_);
                                  testing::internal::EqHelper<true>::
                                  Compare<jaegertracing::SpanContext_const>
                                            ((EqHelper<true> *)local_f80,"nullptr",
                                             "extractedCtx.get()",(Secret *)0x0,pSVar8);
                                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                    ((AssertionResult *)local_f80);
                                  if (!bVar1) {
                                    testing::Message::Message(local_f88);
                                    pcVar6 = testing::AssertionResult::failure_message
                                                       ((AssertionResult *)local_f80);
                                    testing::internal::AssertHelper::AssertHelper
                                              (local_f90,kFatalFailure,
                                               "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                                               ,0x1b5,pcVar6);
                                    testing::internal::AssertHelper::operator=(local_f90,local_f88);
                                    testing::internal::AssertHelper::~AssertHelper(local_f90);
                                    testing::Message::~Message(local_f88);
                                  }
                                  bVar1 = !bVar1;
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)local_f80);
                                  if (!bVar1) {
                                    std::
                                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ::clear((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)&headerWriter._keyValuePairs);
                                    pSVar4 = std::
                                             unique_ptr<jaegertracing::Span,_std::default_delete<jaegertracing::Span>_>
                                             ::operator->(&local_48);
                                    pSVar9 = (SpanContext *)(**(code **)(*(long *)pSVar4 + 0x50))();
                                    pTVar12 = SpanContext::traceID(pSVar9);
                                    pSVar4 = std::
                                             unique_ptr<jaegertracing::Span,_std::default_delete<jaegertracing::Span>_>
                                             ::operator->(&local_48);
                                    pSVar9 = (SpanContext *)(**(code **)(*(long *)pSVar4 + 0x50))();
                                    uVar13 = SpanContext::spanID(pSVar9);
                                    pSVar4 = std::
                                             unique_ptr<jaegertracing::Span,_std::default_delete<jaegertracing::Span>_>
                                             ::operator->(&local_48);
                                    pSVar9 = (SpanContext *)(**(code **)(*(long *)pSVar4 + 0x50))();
                                    uVar14 = SpanContext::parentID(pSVar9);
                                    pSVar4 = std::
                                             unique_ptr<jaegertracing::Span,_std::default_delete<jaegertracing::Span>_>
                                             ::operator->(&local_48);
                                    pSVar9 = (SpanContext *)(**(code **)(*(long *)pSVar4 + 0x50))();
                                    flags = SpanContext::flags(pSVar9);
                                    local_1170 = &local_1168;
                                    std::
                                    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
                                              (local_1170,(char (*) [2])0x36150f,
                                               (char (*) [2])0x360cdf);
                                    local_1170 = &local_1128;
                                    std::
                                    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
                                              (local_1170,(char (*) [2])0x36bc21,
                                               (char (*) [2])0x36d55b);
                                    local_1170 = &local_10e8;
                                    std::
                                    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
                                              (local_1170,(char (*) [2])0x35fa66,
                                               (char (*) [2])0x362afc);
                                    local_10a8 = &local_1168;
                                    local_10a0 = 3;
                                    std::
                                    allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::allocator(&local_1173);
                                    __l._M_len = local_10a0;
                                    __l._M_array = local_10a8;
                                    std::
                                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ::unordered_map(&local_1098,__l,0,&local_1171,&local_1172,
                                                    &local_1173);
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string
                                              ((string *)&local_1198,"",&local_1199);
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string
                                              ((string *)&local_11c0,"",&local_11c1);
                                    SpanContext::SpanContext
                                              (&local_1060,pTVar12,uVar13,uVar14,flags,&local_1098,
                                               &local_1198,&local_11c0);
                                    SpanContext::operator=((SpanContext *)local_df8,&local_1060);
                                    SpanContext::~SpanContext(&local_1060);
                                    std::__cxx11::string::~string((string *)&local_11c0);
                                    std::allocator<char>::~allocator((allocator<char> *)&local_11c1)
                                    ;
                                    std::__cxx11::string::~string((string *)&local_1198);
                                    std::allocator<char>::~allocator((allocator<char> *)&local_1199)
                                    ;
                                    std::
                                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ::~unordered_map(&local_1098);
                                    std::
                                    allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::~allocator(&local_1173);
                                    local_16a0 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_10a8;
                                    do {
                                      local_16a0 = local_16a0 + -1;
                                      std::
                                      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::~pair(local_16a0);
                                    } while (local_16a0 != &local_1168);
                                    peVar3 = std::
                                             __shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                             ::operator->((
                                                  __shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)local_30);
                                    (**(code **)(*(long *)peVar3 + 0x28))
                                              (&itr,peVar3,local_df8,&gtest_ar__7.message_);
                                    opentracing::v3::expected<void,_std::error_code>::~expected
                                              ((expected<void,_std::error_code> *)&itr);
                                    local_11e8._M_cur =
                                         (__node_type *)
                                         std::
                                         begin<std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
                                                   ((
                                                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)&headerWriter._keyValuePairs);
                                    while( true ) {
                                      local_11f0._M_cur =
                                           (__node_type *)
                                           std::
                                           end<std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
                                                     ((
                                                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)&headerWriter._keyValuePairs);
                                      bVar1 = std::__detail::operator!=(&local_11e8,&local_11f0);
                                      if (!bVar1) break;
                                      ppVar16 = std::__detail::
                                                _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                                                ::operator->((
                                                  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                                                  *)&local_11e8);
                                      std::__cxx11::string::substr
                                                ((ulong)&local_1210,(ulong)ppVar16);
                                      bVar1 = std::operator==(&local_1210,"uberctx-");
                                      std::__cxx11::string::~string((string *)&local_1210);
                                      if (bVar1) {
                                        local_1220._M_cur = local_11e8._M_cur;
                                        local_1218._M_cur =
                                             (__node_type *)
                                             std::
                                             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             ::erase((
                                                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)&headerWriter._keyValuePairs,local_11e8._M_cur);
                                        local_11e8._M_cur = local_1218._M_cur;
                                      }
                                      else {
                                        std::__detail::
                                        _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                                        ::operator++((
                                                  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                                                  *)&local_11e8);
                                      }
                                    }
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string
                                              ((string *)&local_1240,"jaeger-baggage",&local_1241);
                                    pmVar11 = std::
                                              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                              ::operator[]((
                                                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)&headerWriter._keyValuePairs,&local_1240);
                                    std::__cxx11::string::operator=((string *)pmVar11,"a=x,b=y,c=z")
                                    ;
                                    std::__cxx11::string::~string((string *)&local_1240);
                                    std::allocator<char>::~allocator((allocator<char> *)&local_1241)
                                    ;
                                    peVar3 = std::
                                             __shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                             ::operator->((
                                                  __shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)local_30);
                                    (**(code **)(*(long *)peVar3 + 0x48))
                                              (&gtest_ar__14.message_,peVar3,
                                               (undefined1 *)((long)&result_2.contained + 8));
                                    opentracing::v3::
                                    expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                                    ::operator=((expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                                                 *)&gtest_ar__8.message_,
                                                (expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                                                 *)&gtest_ar__14.message_);
                                    opentracing::v3::
                                    expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                                    ::~expected((expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                                                 *)&gtest_ar__14.message_);
                                    local_1271 = opentracing::v3::expected::operator_cast_to_bool
                                                           ((expected *)&gtest_ar__8.message_);
                                    testing::AssertionResult::AssertionResult<bool>
                                              ((AssertionResult *)local_1270,&local_1271,(type *)0x0
                                              );
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_1270);
                                    if (!bVar1) {
                                      testing::Message::Message(local_1280);
                                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                                ((AssertionResult *)&gtest_ar__15.message_,
                                                 local_1270,"static_cast<bool>(result)","false");
                                      pcVar6 = (char *)std::__cxx11::string::c_str();
                                      testing::internal::AssertHelper::AssertHelper
                                                (local_1288,kFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                                                 ,0x1ca,pcVar6);
                                      testing::internal::AssertHelper::operator=
                                                (local_1288,local_1280);
                                      testing::internal::AssertHelper::~AssertHelper(local_1288);
                                      std::__cxx11::string::~string
                                                ((string *)&gtest_ar__15.message_);
                                      testing::Message::~Message(local_1280);
                                    }
                                    bVar1 = !bVar1;
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_1270);
                                    if (!bVar1) {
                                      pvVar7 = opentracing::v3::
                                               expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                                               ::operator->((
                                                  expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                                                  *)&gtest_ar__8.message_);
                                      pSVar8 = (pointer)std::
                                                  unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                                                  ::release(pvVar7);
                                      std::
                                      unique_ptr<const_jaegertracing::SpanContext,_std::default_delete<const_jaegertracing::SpanContext>_>
                                      ::reset((unique_ptr<const_jaegertracing::SpanContext,_std::default_delete<const_jaegertracing::SpanContext>_>
                                               *)&gtest_ar__9.message_,pSVar8);
                                      local_12b9 = std::unique_ptr::operator_cast_to_bool
                                                             ((unique_ptr *)&gtest_ar__9.message_);
                                      testing::AssertionResult::AssertionResult<bool>
                                                ((AssertionResult *)local_12b8,&local_12b9,
                                                 (type *)0x0);
                                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                        ((AssertionResult *)local_12b8);
                                      if (!bVar1) {
                                        testing::Message::Message(local_12c8);
                                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                                  ((AssertionResult *)&gtest_ar_13.message_,
                                                   local_12b8,"static_cast<bool>(extractedCtx)",
                                                   "false");
                                        pcVar6 = (char *)std::__cxx11::string::c_str();
                                        testing::internal::AssertHelper::AssertHelper
                                                  (local_12d0,kFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                                                  ,0x1cc,pcVar6);
                                        testing::internal::AssertHelper::operator=
                                                  (local_12d0,local_12c8);
                                        testing::internal::AssertHelper::~AssertHelper(local_12d0);
                                        std::__cxx11::string::~string
                                                  ((string *)&gtest_ar_13.message_);
                                        testing::Message::~Message(local_12c8);
                                      }
                                      bVar1 = !bVar1;
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)local_12b8);
                                      if (!bVar1) {
                                        local_1304 = 3;
                                        pSVar8 = std::
                                                 unique_ptr<const_jaegertracing::SpanContext,_std::default_delete<const_jaegertracing::SpanContext>_>
                                                 ::operator->((
                                                  unique_ptr<const_jaegertracing::SpanContext,_std::default_delete<const_jaegertracing::SpanContext>_>
                                                  *)&gtest_ar__9.message_);
                                        pSVar15 = SpanContext::baggage_abi_cxx11_(pSVar8);
                                        local_1310 = std::
                                                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::size(pSVar15);
                                        testing::internal::EqHelper<false>::
                                        Compare<int,unsigned_long>
                                                  ((EqHelper<false> *)local_1300,"3",
                                                   "extractedCtx->baggage().size()",&local_1304,
                                                   &local_1310);
                                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                          ((AssertionResult *)local_1300);
                                        if (!bVar1) {
                                          testing::Message::Message(local_1318);
                                          pcVar6 = testing::AssertionResult::failure_message
                                                             ((AssertionResult *)local_1300);
                                          testing::internal::AssertHelper::AssertHelper
                                                    ((AssertHelper *)&gtest_ar_14.message_,
                                                     kFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                                                  ,0x1cd,pcVar6);
                                          testing::internal::AssertHelper::operator=
                                                    ((AssertHelper *)&gtest_ar_14.message_,
                                                     local_1318);
                                          testing::internal::AssertHelper::~AssertHelper
                                                    ((AssertHelper *)&gtest_ar_14.message_);
                                          testing::Message::~Message(local_1318);
                                        }
                                        bVar1 = !bVar1;
                                        testing::AssertionResult::~AssertionResult
                                                  ((AssertionResult *)local_1300);
                                        if (!bVar1) {
                                          pSVar10 = std::
                                                  unique_ptr<const_jaegertracing::SpanContext,_std::default_delete<const_jaegertracing::SpanContext>_>
                                                  ::operator*((
                                                  unique_ptr<const_jaegertracing::SpanContext,_std::default_delete<const_jaegertracing::SpanContext>_>
                                                  *)&gtest_ar__9.message_);
                                          testing::internal::EqHelper<false>::
                                          Compare<jaegertracing::SpanContext,jaegertracing::SpanContext>
                                                    ((EqHelper<false> *)local_1330,"ctx",
                                                     "*extractedCtx",(SpanContext *)local_df8,
                                                     pSVar10);
                                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                            ((AssertionResult *)local_1330);
                                          if (!bVar1) {
                                            testing::Message::Message(local_1338);
                                            pcVar6 = testing::AssertionResult::failure_message
                                                               ((AssertionResult *)local_1330);
                                            testing::internal::AssertHelper::AssertHelper
                                                      (local_1340,kFatalFailure,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                                                  ,0x1ce,pcVar6);
                                            testing::internal::AssertHelper::operator=
                                                      (local_1340,local_1338);
                                            testing::internal::AssertHelper::~AssertHelper
                                                      (local_1340);
                                            testing::Message::~Message(local_1338);
                                          }
                                          bVar1 = !bVar1;
                                          testing::AssertionResult::~AssertionResult
                                                    ((AssertionResult *)local_1330);
                                          if (!bVar1) {
                                            bVar1 = false;
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                          SpanContext::~SpanContext((SpanContext *)local_df8);
                        }
                      }
                    }
                  }
                }
                std::
                unique_ptr<const_jaegertracing::SpanContext,_std::default_delete<const_jaegertracing::SpanContext>_>
                ::~unique_ptr((unique_ptr<const_jaegertracing::SpanContext,_std::default_delete<const_jaegertracing::SpanContext>_>
                               *)&gtest_ar__9.message_);
              }
              opentracing::v3::
              expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
              ::~expected((expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                           *)&gtest_ar__8.message_);
              anon_unknown_16::ReaderMock<opentracing::v3::HTTPHeadersReader>::~ReaderMock
                        ((ReaderMock<opentracing::v3::HTTPHeadersReader> *)
                         ((long)&result_2.contained + 8));
            }
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&gtest_ar_6.message_);
        }
      }
      anon_unknown_16::WriterMock<opentracing::v3::HTTPHeadersWriter>::~WriterMock
                ((WriterMock<opentracing::v3::HTTPHeadersWriter> *)&gtest_ar__7.message_);
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&headerWriter._keyValuePairs);
      if (!bVar1) {
        peVar3 = std::
                 __shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_30);
        (**(code **)(*(long *)peVar3 + 0x58))();
      }
    }
  }
  std::unique_ptr<jaegertracing::Span,_std::default_delete<jaegertracing::Span>_>::~unique_ptr
            (&local_48);
  std::shared_ptr<jaegertracing::Tracer>::~shared_ptr((shared_ptr<jaegertracing::Tracer> *)local_30)
  ;
  std::shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle>::~shared_ptr
            ((shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle> *)
             &tracer.super___shared_ptr<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TEST(Tracer, testPropagation)
{
    const auto handle = testutils::TracerUtil::installGlobalTracer();
    const auto tracer =
        std::static_pointer_cast<Tracer>(opentracing::Tracer::Global());
    const std::unique_ptr<Span> span(static_cast<Span*>(
        tracer->StartSpanWithOptions("test-inject", {}).release()));
    span->SetBaggageItem("test-baggage-item-key", "test baggage item value");

    // Binary
    {
        std::stringstream ss;
        ASSERT_TRUE(static_cast<bool>(tracer->Inject(span->context(), ss)));
        auto result = tracer->Extract(ss);
        ASSERT_TRUE(static_cast<bool>(result));
        std::unique_ptr<const SpanContext> extractedCtx(
            static_cast<SpanContext*>(result->release()));
        ASSERT_TRUE(static_cast<bool>(extractedCtx));
        ASSERT_EQ(span->context(), *extractedCtx);
        FakeSpanContext fakeCtx;
        ss.clear();
        ss.str("");
        ASSERT_FALSE(static_cast<bool>(tracer->Inject(fakeCtx, ss)));
    }

    // Text map
    {
        StrMap textMap;
        WriterMock<opentracing::TextMapWriter> textWriter(textMap);
        ASSERT_TRUE(
            static_cast<bool>(tracer->Inject(span->context(), textWriter)));
        ASSERT_EQ(2, textMap.size());
        std::ostringstream oss;
        oss << span->context();
        ASSERT_EQ(oss.str(), textMap.at(kTraceContextHeaderName));
        ASSERT_EQ("test baggage item value",
                  textMap.at(std::string(kTraceBaggageHeaderPrefix) +
                             "test-baggage-item-key"));
        ReaderMock<opentracing::TextMapReader> textReader(textMap);
        auto result = tracer->Extract(textReader);
        ASSERT_TRUE(static_cast<bool>(result));
        std::unique_ptr<const SpanContext> extractedCtx(
            static_cast<SpanContext*>(result->release()));
        ASSERT_TRUE(static_cast<bool>(extractedCtx));
        ASSERT_EQ(span->context(), *extractedCtx);
    }

    // HTTP map
    {
        StrMap headerMap;
        WriterMock<opentracing::HTTPHeadersWriter> headerWriter(headerMap);
        ASSERT_TRUE(
            static_cast<bool>(tracer->Inject(span->context(), headerWriter)));
        ASSERT_EQ(2, headerMap.size());
        std::ostringstream oss;
        oss << span->context();
        ASSERT_EQ(oss.str(), headerMap.at(kTraceContextHeaderName));
        ASSERT_EQ("test%20baggage%20item%20value",
                  headerMap.at(std::string(kTraceBaggageHeaderPrefix) +
                               "test-baggage-item-key"));
        ReaderMock<opentracing::HTTPHeadersReader> headerReader(headerMap);
        auto result = tracer->Extract(headerReader);
        ASSERT_TRUE(static_cast<bool>(result));
        std::unique_ptr<const SpanContext> extractedCtx(
            static_cast<SpanContext*>(result->release()));
        ASSERT_TRUE(static_cast<bool>(extractedCtx));
        ASSERT_EQ(span->context(), *extractedCtx);

        // Test debug header.
        headerMap.clear();
        headerMap[kJaegerDebugHeader] = "yes";
        tracer->Inject(span->context(), headerWriter);
        result = tracer->Extract(headerReader);
        ASSERT_TRUE(static_cast<bool>(result));
        extractedCtx.reset(static_cast<SpanContext*>(result->release()));
        ASSERT_TRUE(static_cast<bool>(extractedCtx));
        ASSERT_NE(span->context(), *extractedCtx);
        SpanContext ctx(
            span->context().traceID(),
            span->context().spanID(),
            span->context().parentID(),
            span->context().flags() |
                static_cast<unsigned char>(SpanContext::Flag::kDebug),
            span->context().baggage(),
            "yes");
        ASSERT_EQ(ctx, *extractedCtx);

        // Test bad trace context.
        headerMap.clear();
        headerMap[kTraceContextHeaderName] = "12345678";
        result = tracer->Extract(headerReader);
        ASSERT_TRUE(static_cast<bool>(result));
        extractedCtx.reset(static_cast<SpanContext*>(result->release()));
        ASSERT_EQ(nullptr, extractedCtx.get());

        // Test empty map.
        headerMap.clear();
        result = tracer->Extract(headerReader);
        ASSERT_TRUE(static_cast<bool>(result));
        extractedCtx.reset(static_cast<SpanContext*>(result->release()));
        ASSERT_EQ(nullptr, extractedCtx.get());

        // Test alternative baggage format.
        headerMap.clear();
        ctx = SpanContext(span->context().traceID(),
                          span->context().spanID(),
                          span->context().parentID(),
                          span->context().flags(),
                          { { "a", "x" }, { "b", "y" }, { "c", "z" } });
        tracer->Inject(ctx, headerWriter);
        for (auto itr = std::begin(headerMap); itr != std::end(headerMap);) {
            if (itr->first.substr(0, std::strlen(kTraceBaggageHeaderPrefix)) ==
                kTraceBaggageHeaderPrefix) {
                itr = headerMap.erase(itr);
            }
            else {
                ++itr;
            }
        }
        headerMap[kJaegerBaggageHeader] = "a=x,b=y,c=z";
        result = tracer->Extract(headerReader);
        ASSERT_TRUE(static_cast<bool>(result));
        extractedCtx.reset(static_cast<SpanContext*>(result->release()));
        ASSERT_TRUE(static_cast<bool>(extractedCtx));
        ASSERT_EQ(3, extractedCtx->baggage().size());
        ASSERT_EQ(ctx, *extractedCtx);
    }
    tracer->Close();
}